

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O2

void tif_32sto13u(OPJ_INT32 *pSrc,OPJ_BYTE *pDst,OPJ_SIZE_T length)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  OPJ_INT32 OVar6;
  ulong uVar7;
  sbyte sVar8;
  uint uVar9;
  OPJ_BYTE *pOVar10;
  uint uVar11;
  
  for (uVar7 = 0; uVar7 < (length & 0xfffffffffffffff8); uVar7 = uVar7 + 8) {
    uVar11 = pSrc[uVar7];
    uVar9 = pSrc[uVar7 + 1];
    uVar1 = pSrc[uVar7 + 2];
    uVar2 = pSrc[uVar7 + 3];
    uVar3 = pSrc[uVar7 + 4];
    uVar4 = pSrc[uVar7 + 5];
    uVar5 = pSrc[uVar7 + 6];
    OVar6 = pSrc[uVar7 + 7];
    *pDst = (OPJ_BYTE)(uVar11 >> 5);
    pDst[1] = (byte)(uVar9 >> 10) | (byte)(uVar11 << 3);
    pDst[2] = (OPJ_BYTE)(uVar9 >> 2);
    pDst[3] = (byte)(uVar1 >> 7) | (byte)(uVar9 << 6);
    pDst[4] = (byte)(uVar2 >> 0xc) | (char)uVar1 * '\x02';
    pDst[5] = (OPJ_BYTE)(uVar2 >> 4);
    pDst[6] = (byte)(uVar3 >> 9) | (byte)(uVar2 << 4);
    pDst[7] = (OPJ_BYTE)(uVar3 >> 1);
    pDst[8] = (byte)(uVar4 >> 6) | (byte)(uVar3 << 7);
    pDst[9] = (byte)(uVar5 >> 0xb) | (byte)(uVar4 << 2);
    pDst[10] = (OPJ_BYTE)(uVar5 >> 3);
    pDst[0xb] = (byte)((uint)OVar6 >> 8) | (byte)(uVar5 << 5);
    pDst[0xc] = (OPJ_BYTE)OVar6;
    pDst = pDst + 0xd;
  }
  if ((length & 7) != 0) {
    *pDst = (OPJ_BYTE)((uint)pSrc[uVar7] >> 5);
    uVar11 = pSrc[uVar7] & 0x1f;
    uVar9 = (uint)(length & 7);
    if (uVar9 == 1) {
      pOVar10 = pDst + 1;
      sVar8 = 3;
    }
    else {
      pDst[1] = (byte)((uint)pSrc[uVar7 + 1] >> 10) | (byte)(uVar11 << 3);
      uVar11 = pSrc[uVar7 + 1];
      pDst[2] = (OPJ_BYTE)(uVar11 >> 2);
      uVar11 = uVar11 & 3;
      if (uVar9 < 3) {
        pOVar10 = pDst + 3;
        sVar8 = 6;
      }
      else {
        pDst[3] = (byte)((uint)pSrc[uVar7 + 2] >> 7) | (byte)(uVar11 << 6);
        uVar11 = pSrc[uVar7 + 2] & 0x7f;
        if (uVar9 == 3) {
          pOVar10 = pDst + 4;
          sVar8 = 1;
        }
        else {
          pDst[4] = (byte)((uint)pSrc[uVar7 + 3] >> 0xc) | (char)uVar11 * '\x02';
          uVar11 = pSrc[uVar7 + 3];
          pDst[5] = (OPJ_BYTE)(uVar11 >> 4);
          uVar11 = uVar11 & 0xf;
          if (uVar9 < 5) {
            pOVar10 = pDst + 6;
            sVar8 = 4;
          }
          else {
            pDst[6] = (byte)((uint)pSrc[uVar7 + 4] >> 9) | (byte)(uVar11 << 4);
            uVar11 = pSrc[uVar7 + 4];
            pDst[7] = (OPJ_BYTE)(uVar11 >> 1);
            uVar11 = uVar11 & 1;
            if (uVar9 == 5) {
              pOVar10 = pDst + 8;
              sVar8 = 7;
            }
            else {
              pDst[8] = (byte)((uint)pSrc[uVar7 + 5] >> 6) | (byte)(uVar11 << 7);
              uVar11 = pSrc[uVar7 + 5] & 0x3f;
              if (uVar9 == 7) {
                pDst[9] = (byte)((uint)pSrc[uVar7 + 6] >> 0xb) | (byte)(uVar11 << 2);
                uVar11 = pSrc[uVar7 + 6];
                pDst[10] = (OPJ_BYTE)(uVar11 >> 3);
                pOVar10 = pDst + 0xb;
                uVar11 = uVar11 & 7;
                sVar8 = 5;
              }
              else {
                pOVar10 = pDst + 9;
                sVar8 = 2;
              }
            }
          }
        }
      }
    }
    *pOVar10 = (OPJ_BYTE)(uVar11 << sVar8);
  }
  return;
}

Assistant:

static void tif_32sto13u(const OPJ_INT32* pSrc, OPJ_BYTE* pDst,
                         OPJ_SIZE_T length)
{
    OPJ_SIZE_T i;

    for (i = 0; i < (length & ~(OPJ_SIZE_T)7U); i += 8U) {
        OPJ_UINT32 src0 = (OPJ_UINT32)pSrc[i + 0];
        OPJ_UINT32 src1 = (OPJ_UINT32)pSrc[i + 1];
        OPJ_UINT32 src2 = (OPJ_UINT32)pSrc[i + 2];
        OPJ_UINT32 src3 = (OPJ_UINT32)pSrc[i + 3];
        OPJ_UINT32 src4 = (OPJ_UINT32)pSrc[i + 4];
        OPJ_UINT32 src5 = (OPJ_UINT32)pSrc[i + 5];
        OPJ_UINT32 src6 = (OPJ_UINT32)pSrc[i + 6];
        OPJ_UINT32 src7 = (OPJ_UINT32)pSrc[i + 7];

        *pDst++ = (OPJ_BYTE)((src0 >> 5));
        *pDst++ = (OPJ_BYTE)((src0 << 3) | (src1 >> 10));
        *pDst++ = (OPJ_BYTE)((src1 >> 2));
        *pDst++ = (OPJ_BYTE)((src1 << 6) | (src2 >> 7));
        *pDst++ = (OPJ_BYTE)((src2 << 1) | (src3 >> 12));
        *pDst++ = (OPJ_BYTE)((src3 >> 4));
        *pDst++ = (OPJ_BYTE)((src3 << 4) | (src4 >> 9));
        *pDst++ = (OPJ_BYTE)((src4 >> 1));
        *pDst++ = (OPJ_BYTE)((src4 << 7) | (src5 >> 6));
        *pDst++ = (OPJ_BYTE)((src5 << 2) | (src6 >> 11));
        *pDst++ = (OPJ_BYTE)((src6 >> 3));
        *pDst++ = (OPJ_BYTE)((src6 << 5) | (src7 >> 8));
        *pDst++ = (OPJ_BYTE)(src7);
    }

    if (length & 7U) {
        unsigned int trailing = 0U;
        int remaining = 8U;
        length &= 7U;
        PUTBITS2((OPJ_UINT32)pSrc[i + 0], 13)
        if (length > 1U) {
            PUTBITS2((OPJ_UINT32)pSrc[i + 1], 13)
            if (length > 2U) {
                PUTBITS2((OPJ_UINT32)pSrc[i + 2], 13)
                if (length > 3U) {
                    PUTBITS2((OPJ_UINT32)pSrc[i + 3], 13)
                    if (length > 4U) {
                        PUTBITS2((OPJ_UINT32)pSrc[i + 4], 13)
                        if (length > 5U) {
                            PUTBITS2((OPJ_UINT32)pSrc[i + 5], 13)
                            if (length > 6U) {
                                PUTBITS2((OPJ_UINT32)pSrc[i + 6], 13)
                            }
                        }
                    }
                }
            }
        }
        FLUSHBITS()
    }
}